

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReGlob.cpp
# Opt level: O1

string * SudoMaker::ReGlob::RegexpString
                   (string *__return_storage_ptr__,string *glob,config config,bool _is_path)

{
  byte bVar1;
  uchar uVar2;
  char cVar3;
  ulong uVar4;
  pointer pcVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer puVar9;
  long *plVar10;
  undefined3 in_register_00000015;
  char *pcVar11;
  pointer puVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  undefined8 uVar19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> domain;
  string error_msg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  ulong local_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  ulong local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  undefined8 local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_e8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(1);
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = '\0';
  uVar4 = glob->_M_string_length;
  uVar19 = CONCAT35(in_register_00000015,config);
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (uVar4 != 0) {
    local_118 = (ulong)((uint5)config >> 8);
    local_f0 = (ulong)((uint5)config >> 0x20);
    local_b8 = "\\?";
    if (((uint5)config >> 8 & 1) != 0) {
      local_b8 = "(.)";
    }
    bVar18 = false;
    uVar16 = 0;
    local_e0 = CONCAT35(in_register_00000015,config);
    do {
      pcVar5 = (glob->_M_dataplus)._M_p;
      bVar1 = pcVar5[uVar16];
      uVar2 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      cVar6 = (char)__return_storage_ptr__;
      if (bVar1 < 0x3d) {
        if (bVar1 < 0x2a) {
          if (((bVar1 - 0x28 < 2) || (bVar1 == 0x21)) || (bVar1 == 0x24))
          goto switchD_0010725f_caseD_5e;
        }
        else if (bVar1 < 0x2c) {
          if (bVar1 == 0x2a) {
            if (((~bVar18 | _is_path) & 1U) == 0) goto LAB_001073e6;
            if (uVar16 == 0) {
              cVar6 = '\0';
            }
            else {
              cVar6 = pcVar5[uVar16 - 1];
            }
            if ((_is_path & bVar18 & cVar6 != '\0') == 1) {
              if (uVar16 == 1) {
                cVar6 = '\0';
              }
              else {
                cVar6 = pcVar5[uVar16 - 2];
              }
            }
            uVar13 = 0;
            do {
              uVar17 = uVar16;
              cVar3 = pcVar5[uVar17 + 1];
              uVar16 = uVar17 + 1;
              uVar13 = uVar13 + 1;
            } while (cVar3 == '*');
            if ((((((uint)local_e0 >> 0x18 & 1) == 0) || (uVar13 < 2)) ||
                ((cVar6 != '/' && (cVar6 != '\0')))) || ((cVar3 != '/' && (cVar3 != '\0')))) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              uVar16 = uVar17;
            }
            else {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            goto LAB_001073f2;
          }
          if (bVar1 == 0x2b) goto switchD_0010725f_caseD_5e;
        }
        else if (bVar1 == 0x2c) {
          if ((bVar18 != false) || (uVar2 == '\0')) goto LAB_00107509;
          if ((uVar2 != '\x02') && (uVar2 != '\x01')) goto LAB_001073f2;
        }
        else if (bVar1 == 0x2e) goto switchD_0010725f_caseD_5e;
LAB_001073e6:
        std::__cxx11::string::push_back(cVar6);
LAB_001073f2:
        bVar18 = false;
      }
      else {
        if (bVar1 < 0x7b) {
          switch(bVar1) {
          case 0x5b:
            if (bVar18) goto LAB_001073e6;
            if ((local_118 & 1) == 0) goto LAB_001073d9;
            if ((local_f0 & 1) == 0) goto LAB_001073e6;
            lVar15 = (long)local_138.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_138.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start >> 2;
            puVar12 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (0 < lVar15) {
              puVar12 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                        ((long)local_138.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_138.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start & 0xfffffffffffffffc);
              lVar15 = lVar15 + 1;
              puVar9 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 3;
              do {
                if (puVar9[-3] == '\x01') {
                  puVar9 = puVar9 + -3;
                  goto LAB_001075f7;
                }
                if (puVar9[-2] == '\x01') {
                  puVar9 = puVar9 + -2;
                  goto LAB_001075f7;
                }
                if (puVar9[-1] == '\x01') {
                  puVar9 = puVar9 + -1;
                  goto LAB_001075f7;
                }
                if (*puVar9 == '\x01') goto LAB_001075f7;
                lVar15 = lVar15 + -1;
                puVar9 = puVar9 + 4;
              } while (1 < lVar15);
            }
            lVar15 = (long)local_138.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar12;
            if (lVar15 == 1) {
LAB_0010730f:
              puVar9 = puVar12;
              if (*puVar12 != '\x01') {
                puVar9 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
            else if (lVar15 == 2) {
LAB_00107307:
              puVar9 = puVar12;
              if (*puVar12 != '\x01') {
                puVar12 = puVar12 + 1;
                goto LAB_0010730f;
              }
            }
            else {
              puVar9 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              if ((lVar15 == 3) && (puVar9 = puVar12, *puVar12 != '\x01')) {
                puVar12 = puVar12 + 1;
                goto LAB_00107307;
              }
            }
LAB_001075f7:
            if (puVar9 != local_138.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
              puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
              local_50[0] = local_40;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_50,
                         "ReGlob: Cannot group square bracket inside square brackets.","");
              *puVar8 = &PTR__reglob_error_0011db98;
              puVar8[1] = puVar8 + 3;
              puVar8[2] = 0;
              *(undefined1 *)(puVar8 + 3) = 0;
              std::__cxx11::string::operator=((string *)(puVar8 + 1),(string *)local_50);
              __cxa_throw(puVar8,&reglob_error::typeinfo,reglob_error::~reglob_error);
            }
            std::__cxx11::string::push_back(cVar6);
            local_110 = (long *)CONCAT71(local_110._1_7_,1);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&local_138,(uchar *)&local_110);
            goto LAB_001073e6;
          case 0x5c:
            if (bVar18 == false) {
              bVar18 = true;
              goto LAB_001073f5;
            }
            break;
          case 0x5d:
            if (bVar18 != false) goto LAB_001073e6;
            if ((local_118 & 1) != 0) {
              if ((local_f0 & 1) == 0) goto LAB_001073e6;
              if (uVar2 == '\x01') {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1;
                goto LAB_001073f2;
              }
            }
            break;
          case 0x5e:
switchD_0010725f_caseD_5e:
            if (bVar18 != false) goto LAB_001073e6;
LAB_001073d9:
            std::__cxx11::string::push_back(cVar6);
            goto LAB_001073e6;
          default:
            if (bVar1 == 0x3d) goto switchD_0010725f_caseD_5e;
            if (((bVar1 != 0x3f) || (bVar18 != false)) ||
               ((((config.bash_syntax ^ 1U | config.capture) ^ 1) & 1) != 0)) goto LAB_001073e6;
          }
LAB_00107509:
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          goto LAB_001073f2;
        }
        if (bVar1 == 0x7b) {
          if (bVar18 != false) goto LAB_001073e6;
          if ((local_118 & 1) != 0) {
            local_110 = (long *)CONCAT71(local_110._1_7_,2);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&local_138,(uchar *)&local_110);
            std::__cxx11::string::push_back(cVar6);
            if ((local_f0 & 1) == 0) goto LAB_001074b4;
            goto LAB_001073f5;
          }
          goto LAB_001073d9;
        }
        if (bVar1 == 0x7c) goto switchD_0010725f_caseD_5e;
        if ((bVar1 != 0x7d) || (bVar18 != false)) goto LAB_001073e6;
        if ((uVar2 == '\x02' & (byte)local_118) != 1) goto LAB_001073d9;
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
LAB_001074b4:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
LAB_001073f5:
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar4);
    uVar19 = local_e0;
    if (bVar18 != false) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"ReGlob: Escape at the end of line.","");
      *puVar8 = &PTR__reglob_error_0011db98;
      puVar8[1] = puVar8 + 3;
      puVar8[2] = 0;
      *(undefined1 *)(puVar8 + 3) = 0;
      std::__cxx11::string::operator=((string *)(puVar8 + 1),(string *)local_70);
      __cxa_throw(puVar8,&reglob_error::typeinfo,reglob_error::~reglob_error);
    }
  }
  uVar2 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  if (uVar2 == '\0') {
    if (((uint)uVar19 >> 0x10 & 1) != 0) {
      std::operator+(&local_d8,"^",__return_storage_ptr__);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_100 = *plVar10;
        lStack_f8 = plVar7[3];
        local_110 = &local_100;
      }
      else {
        local_100 = *plVar10;
        local_110 = (long *)*plVar7;
      }
      local_108 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_110);
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  pcVar14 = "}";
  if (uVar2 == '\x01') {
    pcVar14 = "]";
  }
  pcVar11 = "";
  if (uVar2 == '\x01') {
    pcVar11 = "";
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar14,pcVar11);
  std::operator+(&local_d8,"ReGlob: unmatched ",&local_b0);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_110 = (long *)*plVar7;
  plVar10 = plVar7 + 2;
  if (local_110 == plVar10) {
    local_100 = *plVar10;
    lStack_f8 = plVar7[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar10;
  }
  local_108 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_110,local_108 + (long)local_110);
  *puVar8 = &PTR__reglob_error_0011db98;
  puVar8[1] = puVar8 + 3;
  puVar8[2] = 0;
  *(undefined1 *)(puVar8 + 3) = 0;
  std::__cxx11::string::operator=((string *)(puVar8 + 1),(string *)local_90);
  __cxa_throw(puVar8,&reglob_error::typeinfo,reglob_error::~reglob_error);
}

Assistant:

std::string ReGlob::RegexpString(const std::string &glob, ReGlob::config config, bool _is_path) {
	enum domains {
		DOMAIN_NONE = 0, DOMAIN_SQUARE_BRACKET = 1, DOMAIN_BRACES = 2
	};

	std::string regexp_str;

	bool escaped = false;

	std::vector<uint8_t> domain(1, DOMAIN_NONE);

	char c;
	uint8_t current_domain;
	for (size_t i = 0, len = glob.size(); i < len; i++) {
		c = glob[i];

		current_domain = domain.back();

		switch (c) {
			case '\\':
				if (escaped) {
					escaped = false;
					regexp_str += "\\\\";
				} else {
					escaped = true;
				}
				break;
			case '$':
			case '^':
			case '+':
			case '.':
			case '(':
			case ')':
			case '=':
			case '!':
			case '|':
				if (!escaped) {
					regexp_str += '\\';
				}
				regexp_str += c;
				escaped = false;
				break;
			case '?':
				if (escaped) {
					regexp_str += c;
				} else {
					if (config.bash_syntax) {
						if (config.capture) {
							regexp_str += "(.)";
						} else {
							regexp_str += '.';
						}
					} else {
						regexp_str += "\\?";
					}
				}
				escaped = false;
				break;

			case '[':
				if (!escaped) {
					if (config.bash_syntax) {
						if (config.capture) {
							if (std::find(domain.begin(), domain.end(), DOMAIN_SQUARE_BRACKET) != domain.end()) {
								throw reglob_error("ReGlob: Cannot group square bracket inside square brackets.");
							}
							regexp_str += '(';
							domain.push_back(DOMAIN_SQUARE_BRACKET);
						}
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case ']':
				if (escaped) {
					regexp_str += c;
				} else {
					if (config.bash_syntax) {
						if (config.capture) {
							if (current_domain == DOMAIN_SQUARE_BRACKET) {
								regexp_str += "])";
								domain.pop_back();
							} else {
								regexp_str += "\\]";
							}
						} else {
							regexp_str += c;
						}
					} else {
						regexp_str += "\\]";
					}
				}
				escaped = false;
				break;

			case '{':
				if (!escaped) {
					if (config.bash_syntax) {
						domain.push_back(DOMAIN_BRACES);
						regexp_str += '(';
						if (!config.capture) {
							regexp_str += "?:";
						}
						break;
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case '}':
				if (!escaped) {
					if (current_domain == DOMAIN_BRACES && config.bash_syntax) {
						domain.pop_back();
						regexp_str += ")";
						break;
					} else {
						regexp_str += '\\';
					}
				}
				regexp_str += c;
				escaped = false;
				break;

			case ',':
				if (!escaped && current_domain != DOMAIN_NONE) {
					if (current_domain == DOMAIN_BRACES) regexp_str += '|';
					else if (current_domain == DOMAIN_SQUARE_BRACKET) regexp_str += c;
				} else {
					regexp_str += "\\,";
				}
				escaped = false;
				break;

			case '*': {
				if (escaped && !_is_path) {
					regexp_str += c;
				} else {
					char prev_char = i ? glob[i - 1] : 0;
					if (prev_char && _is_path && escaped) {
						prev_char = i - 1 ? glob[i - 2] : 0;
					}

					size_t star_cnt = 1;
					while (glob[i + 1] == '*') {
						star_cnt++;
						i++;
					}
					char next_char = glob[i + 1];

					if (!config.globstars) {
						if (config.capture && !escaped) {
							regexp_str += "(.*)";
						} else {
							regexp_str += ".*";
						}
					} else {
						if (star_cnt > 1 && (prev_char == '/' || !prev_char) && (next_char == '/' || !next_char)) {
							if (config.capture && !escaped) {
								regexp_str += "((?:[^/]*(?:/|$))*)";
							} else {
								regexp_str += "(?:[^/]*(?:/|$))*";
							}
							i++;
						} else {
							if (config.capture && !escaped) {
								regexp_str += "([^/]*)";
							} else {
								regexp_str += "[^/]*";
							}
						}
					}
				}
				escaped = false;
				break;
			}
			default:
				regexp_str += c;
				escaped = false;
		}
	}

	current_domain = domain.back();

	if (escaped) {
		throw reglob_error("ReGlob: Escape at the end of line.");
	}
	if (current_domain != DOMAIN_NONE) {
//			printf("Current domain: %d\n", current_domain);
		std::string error_msg = "ReGlob: unmatched " + std::string(current_domain == DOMAIN_SQUARE_BRACKET ? "]" : "}") + " in glob expression";
		throw reglob_error(error_msg);
	}

	if (config.full_match) {
		regexp_str = "^" + regexp_str + "$";
	}

	return regexp_str;
}